

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O3

void __thiscall
cmExportTryCompileFileGenerator::PopulateProperties
          (cmExportTryCompileFileGenerator *this,cmGeneratorTarget *target,
          ImportPropertyMap *properties,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  pointer *pppcVar1;
  iterator __position;
  string *psVar2;
  int iVar3;
  cmValue cVar4;
  mapped_type *pmVar5;
  cmLocalGenerator *this_00;
  string *li;
  string *name;
  undefined8 prop;
  cmGeneratorTarget *pcVar6;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  cmGeneratorTarget *tgt;
  string evalResult;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  cmList depends;
  undefined1 local_b8 [32];
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  ImportPropertyMap *local_60;
  string *local_58;
  vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *local_50;
  cmList local_48;
  
  local_60 = properties;
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_78,target);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[25]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             local_78._M_local_buf,(char (*) [25])"INTERFACE_LINK_LIBRARIES");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[32]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             local_78._M_local_buf,(char (*) [32])"INTERFACE_LINK_LIBRARIES_DIRECT");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[40]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             local_78._M_local_buf,(char (*) [40])"INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE");
  local_58 = (string *)local_78._8_8_;
  if (local_78._M_allocated_capacity != local_78._8_8_) {
    local_50 = (vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
               &this->Exports;
    prop = local_78._M_allocated_capacity;
    do {
      pcVar6 = (cmGeneratorTarget *)(local_b8 + 0x10);
      cVar4 = cmGeneratorTarget::GetProperty(target,(string *)prop);
      if (cVar4.Value != (string *)0x0) {
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_60,(key_type *)prop);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        local_98._M_string_length = (size_type)(((string *)prop)->_M_dataplus)._M_p;
        local_98._M_dataplus._M_p = (pointer)((string *)prop)->_M_string_length;
        __str._M_str = "IMPORTED_LINK_INTERFACE_LIBRARIES";
        __str._M_len = 0x21;
        iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_98,0,0x21,
                           __str);
        if (iVar3 != 0) {
          local_98._M_string_length = (size_type)(((string *)prop)->_M_dataplus)._M_p;
          local_98._M_dataplus._M_p = (pointer)((string *)prop)->_M_string_length;
          __str_00._M_str = "IMPORTED_LINK_DEPENDENT_LIBRARIES";
          __str_00._M_len = 0x21;
          iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_98,0,0x21,
                             __str_00);
          if (iVar3 != 0) {
            local_98._M_string_length = (size_type)(((string *)prop)->_M_dataplus)._M_p;
            local_98._M_dataplus._M_p = (pointer)((string *)prop)->_M_string_length;
            __str_01._M_str = "INTERFACE_LINK_LIBRARIES";
            __str_01._M_len = 0x18;
            iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)&local_98,0,0x18,
                               __str_01);
            if (iVar3 != 0) goto LAB_005df0e5;
          }
        }
        local_b8._8_8_ = 0;
        local_b8[0x10] = '\0';
        local_b8._0_8_ = pcVar6;
        FindTargets(&local_98,this,(string *)prop,target,(string *)local_b8,emitted);
        if ((cmGeneratorTarget *)local_b8._0_8_ != pcVar6) {
          operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
        }
        local_b8._0_8_ = pcVar6;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b8,local_98._M_dataplus._M_p,
                   local_98._M_dataplus._M_p + local_98._M_string_length);
        init._M_len = 1;
        init._M_array = (iterator)local_b8;
        cmList::cmList(&local_48,init);
        name = local_48.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        psVar2 = local_48.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((cmGeneratorTarget *)local_b8._0_8_ != pcVar6) {
          operator_delete((void *)local_b8._0_8_,CONCAT71(local_b8._17_7_,local_b8[0x10]) + 1);
          name = local_48.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          psVar2 = local_48.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; name != psVar2; name = name + 1) {
          this_00 = cmGeneratorTarget::GetLocalGenerator(target);
          local_b8._0_8_ = cmLocalGenerator::FindGeneratorTargetToUse(this_00,name);
          if (((cmGeneratorTarget *)local_b8._0_8_ != (cmGeneratorTarget *)0x0) &&
             (pVar7 = std::
                      _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                      ::_M_insert_unique<cmGeneratorTarget_const*const&>
                                ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                                  *)emitted,(cmGeneratorTarget **)local_b8),
             ((undefined1  [16])pVar7 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
            __position._M_current =
                 (this->Exports).
                 super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->Exports).
                super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
              _M_realloc_insert<cmGeneratorTarget_const*const&>
                        (local_50,__position,(cmGeneratorTarget **)local_b8);
            }
            else {
              *__position._M_current = (cmGeneratorTarget *)local_b8._0_8_;
              pppcVar1 = &(this->Exports).
                          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppcVar1 = *pppcVar1 + 1;
            }
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_48.Values);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
LAB_005df0e5:
      prop = prop + 0x20;
    } while ((string *)prop != local_58);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_78);
  return;
}

Assistant:

void cmExportTryCompileFileGenerator::PopulateProperties(
  const cmGeneratorTarget* target, ImportPropertyMap& properties,
  std::set<cmGeneratorTarget const*>& emitted)
{
  // Look through all non-special properties.
  std::vector<std::string> props = target->GetPropertyKeys();
  // Include special properties that might be relevant here.
  props.emplace_back("INTERFACE_LINK_LIBRARIES");
  props.emplace_back("INTERFACE_LINK_LIBRARIES_DIRECT");
  props.emplace_back("INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE");
  for (std::string const& p : props) {
    cmValue v = target->GetProperty(p);
    if (!v) {
      continue;
    }
    properties[p] = *v;

    if (cmHasLiteralPrefix(p, "IMPORTED_LINK_INTERFACE_LIBRARIES") ||
        cmHasLiteralPrefix(p, "IMPORTED_LINK_DEPENDENT_LIBRARIES") ||
        cmHasLiteralPrefix(p, "INTERFACE_LINK_LIBRARIES")) {
      std::string evalResult =
        this->FindTargets(p, target, std::string(), emitted);

      cmList depends{ evalResult };
      for (std::string const& li : depends) {
        cmGeneratorTarget* tgt =
          target->GetLocalGenerator()->FindGeneratorTargetToUse(li);
        if (tgt && emitted.insert(tgt).second) {
          this->Exports.push_back(tgt);
        }
      }
    }
  }
}